

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

bool __thiscall
crnlib::mipmapped_texture::write_to_file
          (mipmapped_texture *this,char *pFilename,format file_format,crn_comp_params *pComp_params,
          uint32 *pActual_quality_level,float *pActual_bitrate,uint32 image_write_flags)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  cfile_stream write_stream;
  cfile_stream *local_80;
  bool local_78;
  undefined7 uStack_77;
  cfile_stream local_70;
  
  if (pActual_quality_level != (uint32 *)0x0) {
    *pActual_quality_level = 0;
  }
  if (pActual_bitrate != (float *)0x0) {
    *pActual_bitrate = 0.0;
  }
  if ((this->m_faces).m_size == 0) {
    pcVar4 = "Unable to write empty texture";
LAB_00140f70:
    dynamic_string::set(&this->m_last_error,pcVar4,0xffffffff);
    return false;
  }
  if (file_format == cFormatInvalid) {
    file_format = texture_file_types::determine_file_format(pFilename);
  }
  if (file_format == cFormatInvalid) {
    pcVar4 = "Unknown file format";
    goto LAB_00140f70;
  }
  if ((file_format == cFormatCRN) ||
     (pComp_params != (crn_comp_params *)0x0 && file_format == cFormatDDS)) {
    if (pComp_params == (crn_comp_params *)0x0) {
      return false;
    }
    bVar2 = write_comp_texture(this,pFilename,pComp_params,pActual_quality_level,pActual_bitrate);
    return bVar2;
  }
  bVar2 = texture_file_types::supports_mipmaps(file_format);
  if (!bVar2) {
    bVar2 = write_regular_image(this,pFilename,image_write_flags);
    return bVar2;
  }
  if (pComp_params != (crn_comp_params *)0x0) {
    console::warning(
                    "mipmapped_texture::write_to_file: Ignoring CRN compression parameters (currently unsupported for this file type)."
                    );
  }
  data_stream::data_stream(&local_70.super_data_stream);
  local_70.super_data_stream._vptr_data_stream = (_func_int **)&PTR__cfile_stream_001dde30;
  local_70.m_pFile = (FILE *)0x0;
  local_70.m_size._0_1_ = 0;
  local_70.m_size._1_7_ = 0;
  local_70.m_ofs._0_1_ = 0;
  local_70._49_8_ = 0;
  iVar3 = cfile_stream::open(&local_70,pFilename,6,0);
  if ((byte)iVar3 == 0) {
    dynamic_string::dynamic_string
              ((dynamic_string *)&local_80,cVarArg,"Failed creating output file \"%s\"",pFilename);
    pcVar4 = "";
    if ((char *)CONCAT71(uStack_77,local_78) != (char *)0x0) {
      pcVar4 = (char *)CONCAT71(uStack_77,local_78);
    }
    dynamic_string::set(&this->m_last_error,pcVar4,0xffffffff);
    lVar1 = CONCAT71(uStack_77,local_78);
    if ((lVar1 != 0) && ((*(uint *)(lVar1 + -8) ^ *(uint *)(lVar1 + -4)) == 0xffffffff)) {
      crnlib_free((void *)(lVar1 + -0x10));
    }
  }
  else {
    local_78 = true;
    local_80 = &local_70;
    if (file_format == cFormatDDS) {
      bVar2 = write_dds(this,(data_stream_serializer *)&local_80);
      goto LAB_0014103d;
    }
    if (file_format == cFormatKTX) {
      bVar2 = write_ktx(this,(data_stream_serializer *)&local_80);
      goto LAB_0014103d;
    }
  }
  bVar2 = false;
LAB_0014103d:
  cfile_stream::~cfile_stream(&local_70);
  return (bool)((byte)iVar3 & bVar2);
}

Assistant:

bool mipmapped_texture::write_to_file(
    const char* pFilename,
    texture_file_types::format file_format,
    crn_comp_params* pComp_params,
    uint32* pActual_quality_level, float* pActual_bitrate,
    uint32 image_write_flags) {
  if (pActual_quality_level)
    *pActual_quality_level = 0;
  if (pActual_bitrate)
    *pActual_bitrate = 0.0f;

  if (!is_valid()) {
    set_last_error("Unable to write empty texture");
    return false;
  }

  if (file_format == texture_file_types::cFormatInvalid)
    file_format = texture_file_types::determine_file_format(pFilename);

  if (file_format == texture_file_types::cFormatInvalid) {
    set_last_error("Unknown file format");
    return false;
  }

  bool success = false;

  if (((pComp_params) && (file_format == texture_file_types::cFormatDDS)) ||
      (file_format == texture_file_types::cFormatCRN)) {
    if (!pComp_params)
      return false;
    success = write_comp_texture(pFilename, *pComp_params, pActual_quality_level, pActual_bitrate);
  } else if (!texture_file_types::supports_mipmaps(file_format)) {
    success = write_regular_image(pFilename, image_write_flags);
  } else {
    if (pComp_params) {
      console::warning("mipmapped_texture::write_to_file: Ignoring CRN compression parameters (currently unsupported for this file type).");
    }

    cfile_stream write_stream;
    if (!write_stream.open(pFilename, cDataStreamWritable | cDataStreamSeekable)) {
      set_last_error(dynamic_string(cVarArg, "Failed creating output file \"%s\"", pFilename).get_ptr());
      return false;
    }
    data_stream_serializer serializer(write_stream);

    switch (file_format) {
      case texture_file_types::cFormatDDS: {
        success = write_dds(serializer);
        break;
      }
      case texture_file_types::cFormatKTX: {
        success = write_ktx(serializer);
        break;
      }
      default: {
        break;
      }
    }
  }

  return success;
}